

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     sahf<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (uint8_t *ah,Context *context)

{
  Context *context_local;
  uint8_t *ah_local;
  
  Flags::set_from<unsigned_char,(InstructionSet::x86::Flag)2>(&context->flags,*ah);
  Flags::set_from<(InstructionSet::x86::Flag)7>
            (&context->flags,(uint)(((*ah & 0x40) != 0 ^ 0xffU) & 1));
  Flags::set_from<(InstructionSet::x86::Flag)1>(&context->flags,*ah & 0x10);
  Flags::set_from<(InstructionSet::x86::Flag)8>
            (&context->flags,(uint)(((*ah & 4) != 0 ^ 0xffU) & 1));
  Flags::set_from<(InstructionSet::x86::Flag)0>(&context->flags,*ah & 1);
  return;
}

Assistant:

void sahf(
	uint8_t &ah,
	ContextT &context
) {
	/*
		EFLAGS(SF:ZF:0:AF:0:PF:1:CF) ← AH;
	*/
	context.flags.template set_from<uint8_t, Flag::Sign>(ah);
	context.flags.template set_from<Flag::Zero>(!(ah & 0x40));
	context.flags.template set_from<Flag::AuxiliaryCarry>(ah & 0x10);
	context.flags.template set_from<Flag::ParityOdd>(!(ah & 0x04));
	context.flags.template set_from<Flag::Carry>(ah & 0x01);
}